

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O1

PpRgbCfg * get_pp_rgb_Cfg(MppFrameFormat fmt)

{
  PpRgbCfg *pPVar1;
  long lVar2;
  
  pPVar1 = pp_rgb_le_cfgs;
  if ((fmt >> 0x18 & 1) == 0) {
    pPVar1 = pp_rgb_cfgs;
  }
  lVar2 = 0;
  do {
    if (*(MppFrameFormat *)((long)&pPVar1->fmt + lVar2) == fmt) {
      return (PpRgbCfg *)((long)&pPVar1->fmt + lVar2);
    }
    lVar2 = lVar2 + 0x1c;
  } while (lVar2 != 0x118);
  return (PpRgbCfg *)0x0;
}

Assistant:

PpRgbCfg* get_pp_rgb_Cfg(MppFrameFormat fmt)
{
    PpRgbCfg* cfg = NULL;
    PpRgbCfg* cfg_array = NULL;
    RK_U8 i = 0;

    if (MPP_FRAME_FMT_IS_LE(fmt))
        cfg_array = pp_rgb_le_cfgs;
    else
        cfg_array = pp_rgb_cfgs;

    for (i = 0; i < PP_RGB_CFG_LENTH; i++) {
        if (cfg_array[i].fmt ==  fmt) {
            cfg = &cfg_array[i];
            break;
        }
    }

    return cfg;
}